

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testing.c
# Opt level: O0

int testing_base_exit(testing_base tb)

{
  int __status;
  int exit_status;
  testing_base tb_local;
  
  nsync::nsync_mu_lock(&tb->testing_mu);
  nsync::nsync_mu_wait
            (&tb->testing_mu,int_is_zero,&tb->child_count,(_func_int_void_ptr_void_ptr *)0x0);
  __status = tb->exit_status;
  nsync::nsync_mu_unlock(&tb->testing_mu);
  free(tb);
  exit(__status);
}

Assistant:

int testing_base_exit (testing_base tb) {
	int exit_status;
	nsync_mu_lock (&tb->testing_mu);
	nsync_mu_wait (&tb->testing_mu, &int_is_zero, &tb->child_count, NULL);
	exit_status = tb->exit_status;
	nsync_mu_unlock (&tb->testing_mu);
	free (tb);
	exit (exit_status);
	return (exit_status);
}